

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cl_parser.cxx
# Opt level: O2

bool __thiscall cl_parser::parse(cl_parser *this,int argc,char **argv,int optc,option_desc *optv)

{
  option_type oVar1;
  char *__s1;
  char *__s2;
  undefined1 auVar2 [16];
  int iVar3;
  option *poVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  char **ppcVar8;
  option_type *poVar9;
  int iVar10;
  double dVar11;
  size_t local_60;
  long local_48;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)argc;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0x18),0);
  }
  poVar4 = (option *)operator_new__(uVar6);
  this->m_options = poVar4;
  this->m_argc = (ulong)(argc & 0x7fffffff);
  local_48 = (ulong)(argc & 0x7fffffff) - 1;
  local_60 = 0;
  while (1 < argc) {
    ppcVar8 = argv + 1;
    __s1 = *ppcVar8;
    poVar9 = &optv->type;
    iVar10 = optc;
    iVar7 = argc;
    if (*__s1 == '-') {
      while( true ) {
        if (iVar10 < 1) goto LAB_001481ec;
        __s2 = ((option_desc *)(poVar9 + -2))->name;
        iVar3 = strcmp(__s1,__s2);
        if (iVar3 == 0) break;
        iVar10 = iVar10 + -1;
        poVar9 = poVar9 + 4;
      }
      poVar4 = this->m_options;
      sVar5 = local_60 + 1;
      poVar4[local_60].name = __s2;
      oVar1 = *poVar9;
      poVar4[local_60].type = oVar1;
      if (oVar1 == OT_BOOL) {
        poVar4[local_60].field_2.v_bool = true;
        local_60 = sVar5;
      }
      else {
        if (argc == 2) goto LAB_001481ec;
        iVar7 = argc + -1;
        ppcVar8 = argv + 2;
        if (oVar1 == OT_INTEGER) {
          iVar10 = atoi(*ppcVar8);
          poVar4[local_60].field_2.v_integer = iVar10;
          local_60 = sVar5;
        }
        else if (oVar1 == OT_FLOAT) {
          dVar11 = atof(*ppcVar8);
          poVar4[local_60].field_2.v_float = (float)dVar11;
          local_60 = sVar5;
        }
        else {
          if (oVar1 != OT_STRING) goto LAB_001481ec;
          poVar4[local_60].field_2.v_string = *ppcVar8;
          local_60 = sVar5;
        }
      }
    }
    else {
      this->m_options[local_48].name = __s1;
      local_48 = local_48 + -1;
      this->m_num_params = this->m_num_params + 1;
    }
    argv = ppcVar8;
    argc = iVar7 + -1;
  }
  this->m_num_options = local_60;
LAB_001481ec:
  return argc < 2;
}

Assistant:

bool cl_parser::parse(int argc, const char* const argv[],
		int optc, const option_desc* optv)
{
	m_options = new option[argc];
	m_argc = size_t(argc & INT_MAX);

	size_t opt_idx = 0, param_idx = size_t(argc & INT_MAX) - 1;
	for (++argv; argc > 1; ++argv, --argc) {
		if ((*argv)[0] != '-') {
			m_options[param_idx].name = *argv;
			--param_idx;
			++m_num_params;
			continue;
		}
		bool valid = false;
		const option_desc* desc = optv;
		for (int j = optc; j > 0; --j, ++desc) {
			if (std::strcmp(*argv, desc->name) != 0)
				continue;
			valid = true;
			option& opt = m_options[opt_idx++];
			opt.name = desc->name;
			opt.type = desc->type;
			if (opt.type == OT_BOOL) {
				opt.v_bool = true;
			} else if (--argc <= 1) {
				return false;
			} else {
				++argv;
				switch (opt.type) {
				case OT_STRING:
					opt.v_string = *argv;
					break;
				case OT_INTEGER:
					opt.v_integer = std::atoi(*argv);
					break;
				case OT_FLOAT:
					opt.v_float = float(std::atof(*argv));
					break;
				default:
					return false;
				}
			}
			break;
		}
		if (!valid)
			return false;
	}
	m_num_options = opt_idx;
	return true;
}